

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmJsonEncode(jx9_value *pIn,json_private_data *pData)

{
  int iVar1;
  char *pData_00;
  int local_4c;
  char *pcStack_48;
  int c;
  char *zEnd;
  char *zIn;
  char *zNum;
  int local_28;
  sxu32 iLen;
  int iBool;
  int nByte;
  SyBlob *pOut;
  json_private_data *pData_local;
  jx9_value *pIn_local;
  
  _iBool = pData->pOut;
  pOut = (SyBlob *)pData;
  pData_local = (json_private_data *)pIn;
  iVar1 = jx9_value_is_null(pIn);
  if ((iVar1 == 0) && (iVar1 = jx9_value_is_resource((jx9_value *)pData_local), iVar1 == 0)) {
    iVar1 = jx9_value_is_bool((jx9_value *)pData_local);
    if (iVar1 == 0) {
      iVar1 = jx9_value_is_numeric((jx9_value *)pData_local);
      if ((iVar1 == 0) || (iVar1 = jx9_value_is_string((jx9_value *)pData_local), iVar1 != 0)) {
        iVar1 = jx9_value_is_string((jx9_value *)pData_local);
        if (iVar1 == 0) {
          iVar1 = jx9_value_is_json_array((jx9_value *)pData_local);
          if (iVar1 == 0) {
            SyBlobAppend(_iBool,"null",4);
          }
          else {
            *(undefined4 *)&pOut->pBlob = 1;
            iVar1 = jx9_value_is_json_object((jx9_value *)pData_local);
            if (iVar1 == 0) {
              SyBlobAppend(_iBool,"[",1);
              jx9_array_walk((jx9_value *)pData_local,VmJsonArrayEncode,pOut);
              SyBlobAppend(_iBool,"]",1);
            }
            else {
              *(undefined4 *)&pOut->pBlob = 1;
              SyBlobAppend(_iBool,"{",1);
              jx9_array_walk((jx9_value *)pData_local,VmJsonObjectEncode,pOut);
              SyBlobAppend(_iBool,"}",1);
            }
          }
        }
        else {
          zEnd = jx9_value_to_string((jx9_value *)pData_local,(int *)&iLen);
          pcStack_48 = zEnd + (int)iLen;
          SyBlobAppend(_iBool,"\"",1);
          while (zEnd < pcStack_48) {
            local_4c = (int)*zEnd;
            zEnd = zEnd + 1;
            if ((local_4c == 0x22) || (local_4c == 0x5c)) {
              SyBlobAppend(_iBool,"\\",1);
            }
            SyBlobAppend(_iBool,&local_4c,1);
          }
          SyBlobAppend(_iBool,"\"",1);
        }
      }
      else {
        zIn = jx9_value_to_string((jx9_value *)pData_local,(int *)&iLen);
        SyBlobAppend(_iBool,zIn,iLen);
      }
    }
    else {
      local_28 = jx9_value_to_bool((jx9_value *)pData_local);
      zNum._4_4_ = 6;
      if (local_28 != 0) {
        zNum._4_4_ = 5;
      }
      pData_00 = "false";
      if (local_28 != 0) {
        pData_00 = "true";
      }
      SyBlobAppend(_iBool,pData_00,zNum._4_4_ - 1);
    }
  }
  else {
    SyBlobAppend(_iBool,"null",4);
  }
  return 0;
}

Assistant:

static sxi32 VmJsonEncode(
	jx9_value *pIn,          /* Encode this value */
	json_private_data *pData /* Context data */
	){
		SyBlob *pOut = pData->pOut;
		int nByte;
		if( jx9_value_is_null(pIn) || jx9_value_is_resource(pIn)){
			/* null */
			SyBlobAppend(pOut, "null", sizeof("null")-1);
		}else if( jx9_value_is_bool(pIn) ){
			int iBool = jx9_value_to_bool(pIn);
			sxu32 iLen;
			/* true/false */
			iLen = iBool ? sizeof("true") : sizeof("false");
			SyBlobAppend(pOut, iBool ? "true" : "false", iLen-1);
		}else if(  jx9_value_is_numeric(pIn) && !jx9_value_is_string(pIn) ){
			const char *zNum;
			/* Get a string representation of the number */
			zNum = jx9_value_to_string(pIn, &nByte);
			SyBlobAppend(pOut,zNum,nByte);
		}else if( jx9_value_is_string(pIn) ){
				const char *zIn, *zEnd;
				int c;
				/* Encode the string */
				zIn = jx9_value_to_string(pIn, &nByte);
				zEnd = &zIn[nByte];
				/* Append the double quote */
				SyBlobAppend(pOut,"\"", sizeof(char));
				for(;;){
					if( zIn >= zEnd ){
						/* No more input to process */
						break;
					}
					c = zIn[0];
					/* Advance the stream cursor */
					zIn++;
					if( c == '"' || c == '\\' ){
						/* Unescape the character */
						SyBlobAppend(pOut,"\\", sizeof(char));
					}
					/* Append character verbatim */
					SyBlobAppend(pOut,(const char *)&c,sizeof(char));
				}
				/* Append the double quote */
				SyBlobAppend(pOut,"\"",sizeof(char));
		}else if( jx9_value_is_json_array(pIn) ){
			/* Encode the array/object */
			pData->isFirst = 1;
			if( jx9_value_is_json_object(pIn) ){
				/* Encode the object instance */
				pData->isFirst = 1;
				/* Append the curly braces */
				SyBlobAppend(pOut, "{",sizeof(char));
				/* Iterate throw object attribute */
				jx9_array_walk(pIn,VmJsonObjectEncode, pData);
				/* Append the closing curly braces  */
				SyBlobAppend(pOut, "}",sizeof(char));
			}else{
				/* Append the square bracket or curly braces */
				SyBlobAppend(pOut,"[",sizeof(char));
				/* Iterate throw array entries */
				jx9_array_walk(pIn, VmJsonArrayEncode, pData);
				/* Append the closing square bracket or curly braces */
				SyBlobAppend(pOut,"]",sizeof(char));
			}
		}else{
			/* Can't happen */
			SyBlobAppend(pOut,"null",sizeof("null")-1);
		}
		/* All done */
		return JX9_OK;
}